

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_hash_internal(fy_node *fyn,fy_hash_update_fn update_fn,void *state)

{
  fy_token *pfVar1;
  fy_node_pair *pfVar2;
  fy_node *pfVar3;
  long lVar4;
  uint uVar5;
  XXH_errorcode XVar6;
  XXH_errorcode extraout_EAX;
  fy_iter_chunk *curr;
  fy_token *pfVar7;
  void *extraout_RDX;
  void *state_00;
  void *extraout_RDX_00;
  void *state_01;
  void *state_02;
  char *input;
  long lVar8;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar9;
  fy_node_pair *pfStack_250;
  undefined1 local_248 [8];
  fy_token_iter iter;
  int local_34 [2];
  int rc;
  
  if (fyn == (fy_node *)0x0) {
    XVar6 = XXH32_update((XXH32_state_t *)update_fn,"s",1);
    return XVar6;
  }
  uVar5 = (byte)fyn->field_0x34 & 3;
  XVar6 = (&switchD_001250a6::switchdataD_001470c8)[uVar5] + 0x1470c8;
  switch(uVar5) {
  case 0:
    input = "s";
    if (fyn->style == FYNS_ALIAS) {
      input = "A";
    }
    pfStack_250 = (fy_node_pair *)0x1250cc;
    XXH32_update((XXH32_state_t *)update_fn,input,1);
    pfStack_250 = (fy_node_pair *)0x1250df;
    fy_token_iter_start((fyn->field_12).scalar,(fy_token_iter *)local_248);
    pfStack_250 = (fy_node_pair *)0x1250ed;
    curr = fy_token_iter_chunk_next((fy_token_iter *)local_248,(fy_iter_chunk *)0x0,local_34);
    if (curr != (fy_iter_chunk *)0x0) {
      do {
        pfStack_250 = (fy_node_pair *)0x12510f;
        XXH32_update((XXH32_state_t *)update_fn,curr->str,curr->len);
        pfStack_250 = (fy_node_pair *)0x12511d;
        curr = fy_token_iter_chunk_next((fy_token_iter *)local_248,curr,local_34);
      } while (curr != (fy_iter_chunk *)0x0);
    }
    pfStack_250 = (fy_node_pair *)0x125131;
    fy_token_iter_finish((fy_token_iter *)local_248);
    XVar6 = extraout_EAX;
    break;
  case 1:
    pfStack_250 = (fy_node_pair *)0x12516c;
    XVar6 = XXH32_update((XXH32_state_t *)update_fn,"S",1);
    pfVar7 = (fyn->field_12).scalar;
    paVar9 = &fyn->field_12;
    XVar6 = CONCAT31((int3)(XVar6 >> 8),pfVar7 == (fy_token *)paVar9);
    if (pfVar7 != (fy_token *)0x0 && pfVar7 != (fy_token *)paVar9) {
      state_00 = extraout_RDX;
      do {
        pfStack_250 = (fy_node_pair *)0x125196;
        XVar6 = fy_node_hash_internal((fy_node *)pfVar7,update_fn,state_00);
        local_34[0] = 0;
        pfVar7 = (fy_token *)(pfVar7->node).next;
        if (pfVar7 == (fy_token *)paVar9) {
          pfVar7 = (fy_token *)0x0;
        }
        state_00 = extraout_RDX_00;
      } while (pfVar7 != (fy_token *)0x0);
    }
    break;
  case 2:
    pfVar7 = (fyn->field_12).scalar;
    uVar5 = 0;
    if (pfVar7 != (fy_token *)0x0 && pfVar7 != (fy_token *)&fyn->field_12) {
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
        pfVar1 = (fy_token *)(pfVar7->node).next;
        pfVar7 = (fy_token *)0x0;
        if (pfVar1 != (fy_token *)&fyn->field_12) {
          pfVar7 = pfVar1;
        }
      } while (pfVar7 != (fy_token *)0x0);
    }
    lVar4 = -((long)(int)uVar5 * 8 + 0x17U & 0xfffffffffffffff0);
    *(undefined8 *)(local_248 + lVar4 + -8) = 0x125212;
    fy_node_mapping_perform_sort
              (fyn,(fy_node_mapping_sort_fn)0x0,(void *)0x0,(fy_node_pair **)(local_248 + lVar4),
               uVar5);
    *(undefined8 *)(local_248 + lVar4 + -8) = 0x125226;
    XVar6 = XXH32_update((XXH32_state_t *)update_fn,"M",1);
    if (0 < (int)uVar5) {
      iter._512_8_ = (ulong)uVar5;
      lVar8 = 0;
      do {
        pfVar2 = *(fy_node_pair **)((long)(local_248 + lVar4) + lVar8 * 8);
        *(undefined8 *)(local_248 + lVar4 + -8) = 0x125254;
        XXH32_update((XXH32_state_t *)update_fn,"K",1);
        pfVar3 = pfVar2->key;
        *(undefined8 *)(local_248 + lVar4 + -8) = 0x125260;
        fy_node_hash_internal(pfVar3,update_fn,state_01);
        local_34[0] = 0;
        *(undefined8 *)(local_248 + lVar4 + -8) = 0x125278;
        XXH32_update((XXH32_state_t *)update_fn,"V",1);
        pfVar3 = pfVar2->value;
        *(undefined8 *)(local_248 + lVar4 + -8) = 0x12528a;
        XVar6 = fy_node_hash_internal(pfVar3,update_fn,state_02);
        local_34[0] = 0;
        lVar8 = lVar8 + 1;
      } while (iter._512_8_ != lVar8);
    }
  }
  return XVar6;
}

Assistant:

static int
fy_node_hash_internal(struct fy_node *fyn, fy_hash_update_fn update_fn, void *state) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;
    struct fy_node_pair **fynpp;
    struct fy_token_iter iter;
    int i, count, rc;
    const struct fy_iter_chunk *ic;

    if (!fyn) {
        /* NULL */
        update_fn(state, "s", 1);    /* as zero length scalar */
        return 0;
    }

    switch (fyn->type) {
        case FYNT_SEQUENCE:
            /* SEQUENCE */
            update_fn(state, "S", 1);

            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                rc = fy_node_hash_internal(fyni, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_MAPPING:
            count = fy_node_mapping_item_count(fyn);

            fynpp = alloca(sizeof(*fynpp) * (count + 1));
            fy_node_mapping_perform_sort(fyn, NULL, NULL, fynpp, count);

            /* MAPPING */
            update_fn(state, "M", 1);

            for (i = 0; i < count; i++) {
                fynp = fynpp[i];

                /* MAPPING KEY */
                update_fn(state, "K", 1);
                rc = fy_node_hash_internal(fynp->key, update_fn, state);
                if (rc)
                    return rc;

                /* MAPPING VALUE */
                update_fn(state, "V", 1);
                rc = fy_node_hash_internal(fynp->value, update_fn, state);
                if (rc)
                    return rc;
            }

            break;

        case FYNT_SCALAR:
            update_fn(state, !fy_node_is_alias(fyn) ? "s" : "A", 1);

            fy_token_iter_start(fyn->scalar, &iter);
            ic = NULL;
            while ((ic = fy_token_iter_chunk_next(&iter, ic, &rc)) != NULL)
                update_fn(state, ic->str, ic->len);
            fy_token_iter_finish(&iter);

            break;
    }

    return 0;
}